

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

bool slang::parsing::Preprocessor::isSameMacro
               (DefineDirectiveSyntax *left,DefineDirectiveSyntax *right)

{
  Token right_00;
  Token left_00;
  long lVar1;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *this;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *pSVar2;
  MacroFormalArgumentSyntax *pMVar3;
  Info *in_RSI;
  long in_RDI;
  MacroFormalArgumentSyntax *rightArg;
  MacroFormalArgumentSyntax *leftArg;
  iterator raIt;
  iterator laIt;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *ra;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *la;
  iterator_base<slang::syntax::MacroFormalArgumentSyntax_*> *in_stack_ffffffffffffff48;
  ParentList *this_00;
  self_type in_stack_ffffffffffffff58;
  TokenList *in_stack_ffffffffffffff90;
  TokenList *in_stack_ffffffffffffff98;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  if ((*(long *)(in_RDI + 0x38) != 0) == (in_RSI[3].location != (SourceLocation)0x0)) {
    if (*(long *)(in_RDI + 0x38) != 0) {
      lVar1 = *(long *)(in_RDI + 0x38) + 0x28;
      this = (SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *)
             slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::size
                       ((SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *)0x374973);
      pSVar2 = (SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *)
               slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::size
                         ((SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *)0x374985)
      ;
      if (this != pSVar2) {
        return false;
      }
      slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::begin
                ((SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *)0x3749ac);
      slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::begin
                ((SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *)0x3749c9);
      while( true ) {
        this_00 = in_stack_ffffffffffffff58.list;
        slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::end(this);
        bVar4 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>_>
                          ((self_type *)this,in_stack_ffffffffffffff48);
        if (((bVar4 ^ 0xffU) & 1) == 0) break;
        pMVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_false>
                 ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_false>
                              *)0x374a14);
        in_stack_ffffffffffffff98 =
             (TokenList *)
             iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_false>
                          *)0x374a23);
        in_stack_ffffffffffffff90 = (TokenList *)(pMVar3->name).info;
        left_00.info._0_7_ = in_stack_fffffffffffffff8;
        left_00.kind = (short)in_RDI;
        left_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
        left_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
        left_00.rawLen = (int)((ulong)in_RDI >> 0x20);
        left_00.info._7_1_ = in_stack_ffffffffffffffff;
        right_00.info = in_RSI;
        right_00.kind = (short)lVar1;
        right_00._2_1_ = (char)((ulong)lVar1 >> 0x10);
        right_00.numFlags.raw = (char)((ulong)lVar1 >> 0x18);
        right_00.rawLen = (int)((ulong)lVar1 >> 0x20);
        bVar4 = isSameToken(left_00,right_00);
        if (!bVar4) {
          return false;
        }
        if ((pMVar3->defaultValue != (MacroArgumentDefaultSyntax *)0x0) !=
            ((in_stack_ffffffffffffff98->super_span<slang::parsing::Token,_18446744073709551615UL>).
             _M_ptr != (pointer)0x0)) {
          return false;
        }
        if ((pMVar3->defaultValue != (MacroArgumentDefaultSyntax *)0x0) &&
           (bVar4 = isSameTokenList(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90), !bVar4)) {
          return false;
        }
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_false>
                    *)this_00,(int)((ulong)this >> 0x20));
        in_stack_ffffffffffffff58 =
             iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_false>
             ::
             operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>_>
                       ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::iterator_base<slang::syntax::MacroFormalArgumentSyntax_*>,_false>
                         *)this_00,(int)((ulong)this >> 0x20));
      }
    }
    bVar4 = isSameTokenList(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Preprocessor::isSameMacro(const DefineDirectiveSyntax& left,
                               const DefineDirectiveSyntax& right) {
    // Names are assumed to match already.
    if (bool(left.formalArguments) != bool(right.formalArguments))
        return false;

    if (left.formalArguments) {
        auto& la = left.formalArguments->args;
        auto& ra = right.formalArguments->args;
        if (la.size() != ra.size())
            return false;

        for (auto laIt = la.begin(), raIt = ra.begin(); laIt != la.end(); laIt++, raIt++) {
            auto leftArg = *laIt;
            auto rightArg = *raIt;
            if (!isSameToken(leftArg->name, rightArg->name))
                return false;

            if (bool(leftArg->defaultValue) != bool(rightArg->defaultValue))
                return false;

            if (leftArg->defaultValue) {
                if (!isSameTokenList(leftArg->defaultValue->tokens, rightArg->defaultValue->tokens))
                    return false;
            }
        }
    }

    return isSameTokenList(left.body, right.body);
}